

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ColorEqual
          (ComputeShaderBase *this,vec3 *c0,vec3 *c1,vec4 *epsilon)

{
  float fVar1;
  float fVar2;
  GLfloat GVar3;
  vec4 *epsilon_local;
  vec3 *c1_local;
  vec3 *c0_local;
  ComputeShaderBase *this_local;
  
  fVar1 = tcu::Vector<float,_3>::x(c0);
  fVar2 = tcu::Vector<float,_3>::x(c1);
  GVar3 = distance(this,fVar1,fVar2);
  fVar1 = tcu::Vector<float,_4>::x(epsilon);
  if (GVar3 <= fVar1) {
    fVar1 = tcu::Vector<float,_3>::y(c0);
    fVar2 = tcu::Vector<float,_3>::y(c1);
    GVar3 = distance(this,fVar1,fVar2);
    fVar1 = tcu::Vector<float,_4>::y(epsilon);
    if (GVar3 <= fVar1) {
      fVar1 = tcu::Vector<float,_3>::z(c0);
      fVar2 = tcu::Vector<float,_3>::z(c1);
      GVar3 = distance(this,fVar1,fVar2);
      fVar1 = tcu::Vector<float,_4>::z(epsilon);
      if (GVar3 <= fVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool ColorEqual(const vec3& c0, const vec3& c1, const vec4& epsilon)
	{
		if (distance(c0.x(), c1.x()) > epsilon.x())
			return false;
		if (distance(c0.y(), c1.y()) > epsilon.y())
			return false;
		if (distance(c0.z(), c1.z()) > epsilon.z())
			return false;
		return true;
	}